

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O1

void XlatParseFree(void *p,_func_void_void_ptr *freeProc)

{
  yyParser *pParser;
  
  if (p != (void *)0x0) {
    while ((long)p + 0x18U < *p) {
      yy_pop_parser_stack((yyParser *)p);
    }
    (*freeProc)(p);
    return;
  }
  return;
}

Assistant:

void XlatParseFree(
  void *p,                    /* The parser to be deleted */
  void (CDECL *freeProc)(void*)     /* Function used to reclaim memory */
){
  yyParser *pParser = (yyParser*)p;
#ifndef YYPARSEFREENEVERNULL
  if( pParser==0 ) return;
#endif
  while( pParser->yytos>pParser->yystack ) yy_pop_parser_stack(pParser);
#if YYSTACKDEPTH<=0
  if( pParser->yystack!=&pParser->yystk0 ) free(pParser->yystack);
#endif
  (*freeProc)((void*)pParser);
}